

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

void __thiscall Am_Image_Array_Data::Am_Image_Array_Data(Am_Image_Array_Data *this)

{
  Am_Image_Array_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411480;
  this->x_hot = -1;
  this->y_hot = -1;
  this->colors = (XColor *)0x0;
  this->num_colors = 0;
  this->main_bitmap = 0;
  this->main_mask = 0;
  this->main_inverted_mask = 0;
  this->image_ = (Am_Generic_Image *)0x0;
  this->name = (char *)0x0;
  this->main_display = (Display *)0x0;
  this->head = (Bitmap_Item *)0x0;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Image_Array_Data::Am_Image_Array_Data()
{
  x_hot = -1;
  y_hot = -1;
  colors = nullptr;
  num_colors = 0;
  main_bitmap = 0;
  main_mask = 0;
  main_inverted_mask = 0;
  image_ = nullptr;
  name = nullptr;
  main_display = nullptr;
  head = nullptr;
  next = list;
  list = this;
}